

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Board.cpp
# Opt level: O0

void __thiscall Board::SetGlider(Board *this,int fromTopEdge,int fromLeftEdge)

{
  initializer_list<Cord> __l;
  allocator<Cord> local_69;
  Cord local_68;
  Cord local_60;
  Cord local_58;
  Cord local_50;
  Cord local_48;
  Cord *local_40;
  size_type local_38;
  undefined1 local_30 [8];
  vector<Cord,_std::allocator<Cord>_> glider;
  int fromLeftEdge_local;
  int fromTopEdge_local;
  Board *this_local;
  
  glider.super__Vector_base<Cord,_std::allocator<Cord>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._0_4_ = fromLeftEdge;
  glider.super__Vector_base<Cord,_std::allocator<Cord>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = fromTopEdge;
  GenerateEmptyBoard(this);
  Cord::Cord(&local_68,0,1);
  Cord::Cord(&local_60,1,2);
  Cord::Cord(&local_58,2,0);
  Cord::Cord(&local_50,2,1);
  Cord::Cord(&local_48,2,2);
  local_38 = 5;
  local_40 = &local_68;
  std::allocator<Cord>::allocator(&local_69);
  __l._M_len = local_38;
  __l._M_array = local_40;
  std::vector<Cord,_std::allocator<Cord>_>::vector
            ((vector<Cord,_std::allocator<Cord>_> *)local_30,__l,&local_69);
  std::allocator<Cord>::~allocator(&local_69);
  PopulateBoard(this,(vector<Cord,_std::allocator<Cord>_> *)local_30,
                glider.super__Vector_base<Cord,_std::allocator<Cord>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage._4_4_,
                (int)glider.super__Vector_base<Cord,_std::allocator<Cord>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage);
  std::vector<Cord,_std::allocator<Cord>_>::~vector((vector<Cord,_std::allocator<Cord>_> *)local_30)
  ;
  return;
}

Assistant:

void Board::SetGlider(int fromTopEdge, int fromLeftEdge)
{
    GenerateEmptyBoard();
    
    const std::vector<Cord> glider {Cord(0, 1), Cord(1, 2), Cord(2, 0), Cord(2, 1), Cord(2, 2)};

    PopulateBoard(glider, fromTopEdge, fromLeftEdge);
}